

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O1

KindMeta get_kind_meta(Kind kind)

{
  Kind KVar1;
  CharBuff *buff;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  KindMeta KVar5;
  
  uVar4 = (ulong)kind;
  buff = new_buff(2);
  if (kind < 0x80) {
    append_chr(buff,(char)kind);
    pcVar2 = to_string(buff);
    recycle_buff(buff);
  }
  else {
    lVar3 = 8;
    pcVar2 = (char *)0x0;
    do {
      KVar1 = *(Kind *)((long)&kind_table[0x34].name + lVar3);
      if (KVar1 == kind) {
        pcVar2 = *(char **)((long)&kind_table[0].kind + lVar3);
        uVar4 = (ulong)KVar1;
        goto LAB_00102d94;
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x358);
    uVar4 = 0xd1;
  }
LAB_00102d94:
  KVar5.name = pcVar2;
  KVar5._0_8_ = uVar4;
  return KVar5;
}

Assistant:

KindMeta get_kind_meta(Kind kind) {
    CharBuff *buff = new_buff(2);
    if (kind != NEWLINE && kind >= 0 && kind <= 127) {
        KindMeta *meta = malloc(sizeof(KindMeta));
        append_chr(buff, (char) kind);
        meta->kind = kind;
        meta->name = to_string(buff);
        recycle_buff(buff);
        return *meta;
    } else {
        for (int i = 0; i < kind_count; ++i) {
            if (kind_table[i].kind == kind) {
                return kind_table[i];
            }
        }
    }
    return EMPTY_KIND;
}